

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

uint256 * SignatureHash<CMutableTransaction>
                    (CScript *scriptCode,CMutableTransaction *txTo,uint nIn,int32_t nHashType,
                    CAmount *amount,SigVersion sigversion,PrecomputedTransactionData *cache)

{
  base_blob<256U> *pbVar1;
  byte bVar2;
  size_type sVar3;
  CMutableTransaction *pCVar4;
  HashWriter *pHVar5;
  uint in_ECX;
  CMutableTransaction *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  long in_stack_00000010;
  bool cacheready;
  CTransactionSignatureSerializer<CMutableTransaction> txTmp;
  HashWriter ss;
  HashWriter ss_1;
  HashWriter ss_2;
  uint256 hashOutputs;
  uint256 hashSequence;
  uint256 hashPrevouts;
  HashWriter *in_stack_fffffffffffffd08;
  CMutableTransaction *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  byte bVar6;
  CMutableTransaction *this;
  undefined1 local_280 [104];
  undefined1 local_218 [104];
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined1 local_190 [136];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffd08);
  if (sVar3 <= in_ECX) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x622,
                  "uint256 SignatureHash(const CScript &, const T &, unsigned int, int32_t, const CAmount &, SigVersion, const PrecomputedTransactionData *) [T = CMutableTransaction]"
                 );
  }
  if (in_stack_00000008 == 1) {
    uint256::uint256((uint256 *)in_stack_fffffffffffffd08);
    uint256::uint256((uint256 *)in_stack_fffffffffffffd08);
    uint256::uint256((uint256 *)in_stack_fffffffffffffd08);
    bVar6 = 0;
    if (in_stack_00000010 != 0) {
      bVar6 = *(byte *)(in_stack_00000010 + 0x101);
    }
    bVar2 = bVar6 & 1;
    if ((in_R8D & 0x80) == 0) {
      if (bVar2 == 0) {
        anon_unknown.dwarf_15824b8::GetPrevoutsSHA256<CMutableTransaction>(in_RDI);
        SHA256Uint256((uint256 *)in_RDI);
      }
      else {
        local_88 = *(undefined8 *)(in_stack_00000010 + 0xa1);
        local_80 = *(undefined8 *)(in_stack_00000010 + 0xa9);
        local_78 = *(undefined8 *)(in_stack_00000010 + 0xb1);
        local_70 = *(undefined8 *)(in_stack_00000010 + 0xb9);
      }
      local_28 = local_88;
      local_20 = local_80;
      local_18 = local_78;
      local_10 = local_70;
    }
    if ((((in_R8D & 0x80) == 0) && ((in_R8D & 0x1f) != 3)) && ((in_R8D & 0x1f) != 2)) {
      if (bVar2 == 0) {
        anon_unknown.dwarf_15824b8::GetSequencesSHA256<CMutableTransaction>(in_RDI);
        SHA256Uint256((uint256 *)in_RDI);
      }
      else {
        local_c8 = *(undefined8 *)(in_stack_00000010 + 0xc1);
        local_c0 = *(undefined8 *)(in_stack_00000010 + 0xc9);
        local_b8 = *(undefined8 *)(in_stack_00000010 + 0xd1);
        local_b0 = *(undefined8 *)(in_stack_00000010 + 0xd9);
      }
      local_48 = local_c8;
      local_40 = local_c0;
      local_38 = local_b8;
      local_30 = local_b0;
    }
    if (((in_R8D & 0x1f) == 3) || ((in_R8D & 0x1f) == 2)) {
      if ((in_R8D & 0x1f) == 3) {
        in_stack_fffffffffffffd10 = (CMutableTransaction *)(ulong)in_ECX;
        pCVar4 = (CMutableTransaction *)
                 std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                           ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd08);
        if (in_stack_fffffffffffffd10 < pCVar4) {
          memset(local_190,0,0x68);
          HashWriter::HashWriter(in_stack_fffffffffffffd08);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT17(bVar6,in_stack_fffffffffffffd18),(size_type)in_stack_fffffffffffffd10)
          ;
          HashWriter::operator<<
                    ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
                     (CTxOut *)in_stack_fffffffffffffd10);
          HashWriter::GetHash((HashWriter *)this);
          local_68 = local_1b0;
          local_60 = local_1a8;
          local_58 = local_1a0;
          local_50 = local_198;
        }
      }
    }
    else {
      if (bVar2 == 0) {
        anon_unknown.dwarf_15824b8::GetOutputsSHA256<CMutableTransaction>(in_RDI);
        SHA256Uint256((uint256 *)in_RDI);
      }
      else {
        local_108 = *(undefined8 *)(in_stack_00000010 + 0xe1);
        local_100 = *(undefined8 *)(in_stack_00000010 + 0xe9);
        local_f8 = *(undefined8 *)(in_stack_00000010 + 0xf1);
        local_f0 = *(undefined8 *)(in_stack_00000010 + 0xf9);
      }
      local_68 = local_108;
      local_60 = local_100;
      local_58 = local_f8;
      local_50 = local_f0;
    }
    memset(local_218,0,0x68);
    HashWriter::HashWriter(in_stack_fffffffffffffd08);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (uint *)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (uint256 *)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (uint256 *)in_stack_fffffffffffffd10);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (size_type)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (COutPoint *)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (CScript *)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (long *)in_stack_fffffffffffffd10);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (size_type)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (uint *)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (uint256 *)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (uint *)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
               (int *)in_stack_fffffffffffffd10);
    HashWriter::GetHash((HashWriter *)this);
  }
  else {
    if ((in_R8D & 0x1f) == 3) {
      in_stack_fffffffffffffd08 = (HashWriter *)(ulong)in_ECX;
      pHVar5 = (HashWriter *)
               std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                         ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd08);
      if (pHVar5 <= in_stack_fffffffffffffd08) {
        *(uchar *)&(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start = '\x01';
        *(uchar *)((long)&(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start + 1) = '\0';
        *(uchar *)((long)&(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start + 2) = '\0';
        *(uchar *)((long)&(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start + 3) = '\0';
        *(uchar *)((long)&(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start + 4) = '\0';
        *(uchar *)((long)&(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start + 5) = '\0';
        *(uchar *)((long)&(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start + 6) = '\0';
        *(uchar *)((long)&(in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start + 7) = '\0';
        pbVar1 = (base_blob<256U> *)&in_RDI->vin;
        (pbVar1->m_data)._M_elems[8] = '\0';
        (pbVar1->m_data)._M_elems[9] = '\0';
        (pbVar1->m_data)._M_elems[10] = '\0';
        (pbVar1->m_data)._M_elems[0xb] = '\0';
        (pbVar1->m_data)._M_elems[0xc] = '\0';
        (pbVar1->m_data)._M_elems[0xd] = '\0';
        (pbVar1->m_data)._M_elems[0xe] = '\0';
        (pbVar1->m_data)._M_elems[0xf] = '\0';
        pbVar1 = (base_blob<256U> *)&in_RDI->vin;
        (pbVar1->m_data)._M_elems[0x10] = '\0';
        (pbVar1->m_data)._M_elems[0x11] = '\0';
        (pbVar1->m_data)._M_elems[0x12] = '\0';
        (pbVar1->m_data)._M_elems[0x13] = '\0';
        (pbVar1->m_data)._M_elems[0x14] = '\0';
        (pbVar1->m_data)._M_elems[0x15] = '\0';
        (pbVar1->m_data)._M_elems[0x16] = '\0';
        (pbVar1->m_data)._M_elems[0x17] = '\0';
        (in_RDI->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0;
        goto LAB_00e94b55;
      }
    }
    anon_unknown.dwarf_15824b8::CTransactionSignatureSerializer<CMutableTransaction>::
    CTransactionSignatureSerializer
              ((CTransactionSignatureSerializer<CMutableTransaction> *)
               CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               in_stack_fffffffffffffd10,(CScript *)in_stack_fffffffffffffd08,0,0xe94b0f);
    memset(local_280,0,0x68);
    HashWriter::HashWriter(in_stack_fffffffffffffd08);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               (CTransactionSignatureSerializer<CMutableTransaction> *)in_stack_fffffffffffffd10);
    HashWriter::operator<<
              ((HashWriter *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               (int *)in_stack_fffffffffffffd10);
    HashWriter::GetHash((HashWriter *)this);
  }
LAB_00e94b55:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (uint256 *)this;
}

Assistant:

uint256 SignatureHash(const CScript& scriptCode, const T& txTo, unsigned int nIn, int32_t nHashType, const CAmount& amount, SigVersion sigversion, const PrecomputedTransactionData* cache)
{
    assert(nIn < txTo.vin.size());

    if (sigversion == SigVersion::WITNESS_V0) {
        uint256 hashPrevouts;
        uint256 hashSequence;
        uint256 hashOutputs;
        const bool cacheready = cache && cache->m_bip143_segwit_ready;

        if (!(nHashType & SIGHASH_ANYONECANPAY)) {
            hashPrevouts = cacheready ? cache->hashPrevouts : SHA256Uint256(GetPrevoutsSHA256(txTo));
        }

        if (!(nHashType & SIGHASH_ANYONECANPAY) && (nHashType & 0x1f) != SIGHASH_SINGLE && (nHashType & 0x1f) != SIGHASH_NONE) {
            hashSequence = cacheready ? cache->hashSequence : SHA256Uint256(GetSequencesSHA256(txTo));
        }


        if ((nHashType & 0x1f) != SIGHASH_SINGLE && (nHashType & 0x1f) != SIGHASH_NONE) {
            hashOutputs = cacheready ? cache->hashOutputs : SHA256Uint256(GetOutputsSHA256(txTo));
        } else if ((nHashType & 0x1f) == SIGHASH_SINGLE && nIn < txTo.vout.size()) {
            HashWriter ss{};
            ss << txTo.vout[nIn];
            hashOutputs = ss.GetHash();
        }

        HashWriter ss{};
        // Version
        ss << txTo.version;
        // Input prevouts/nSequence (none/all, depending on flags)
        ss << hashPrevouts;
        ss << hashSequence;
        // The input being signed (replacing the scriptSig with scriptCode + amount)
        // The prevout may already be contained in hashPrevout, and the nSequence
        // may already be contain in hashSequence.
        ss << txTo.vin[nIn].prevout;
        ss << scriptCode;
        ss << amount;
        ss << txTo.vin[nIn].nSequence;
        // Outputs (none/one/all, depending on flags)
        ss << hashOutputs;
        // Locktime
        ss << txTo.nLockTime;
        // Sighash type
        ss << nHashType;

        return ss.GetHash();
    }

    // Check for invalid use of SIGHASH_SINGLE
    if ((nHashType & 0x1f) == SIGHASH_SINGLE) {
        if (nIn >= txTo.vout.size()) {
            //  nOut out of range
            return uint256::ONE;
        }
    }

    // Wrapper to serialize only the necessary parts of the transaction being signed
    CTransactionSignatureSerializer<T> txTmp(txTo, scriptCode, nIn, nHashType);

    // Serialize and hash
    HashWriter ss{};
    ss << txTmp << nHashType;
    return ss.GetHash();
}